

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O3

void Gls_ManStop(Gls_Man_t *p)

{
  Vec_Str_t *pVVar1;
  char *pcVar2;
  int *piVar3;
  Vec_Wrd_t *__ptr;
  word *__ptr_00;
  Vec_Wec_t *pVVar4;
  void *pvVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  long lVar9;
  
  pVVar1 = p->vLines;
  pcVar2 = pVVar1->pArray;
  if (pcVar2 != (char *)0x0) {
    free(pcVar2);
  }
  free(pVVar1);
  pVVar1 = p->vTypes;
  pcVar2 = pVVar1->pArray;
  if (pcVar2 != (char *)0x0) {
    free(pcVar2);
  }
  free(pVVar1);
  pVVar7 = p->vIndexes;
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  pVVar7 = p->vLut4s;
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  pVVar7 = p->vLut4TTs;
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  pVVar7 = p->vLut6s;
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  __ptr = p->vLut6TTs;
  __ptr_00 = __ptr->pArray;
  if (__ptr_00 != (word *)0x0) {
    free(__ptr_00);
  }
  free(__ptr);
  pVVar7 = p->vBoxes;
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  pVVar7 = p->vDelays;
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  pVVar4 = p->vDelayIns;
  iVar6 = pVVar4->nCap;
  pVVar7 = pVVar4->pArray;
  if (iVar6 < 1) {
    if (pVVar7 != (Vec_Int_t *)0x0) goto LAB_0074b29c;
  }
  else {
    lVar9 = 8;
    lVar8 = 0;
    do {
      pvVar5 = *(void **)((long)&pVVar7->nCap + lVar9);
      if (pvVar5 != (void *)0x0) {
        free(pvVar5);
        pVVar7 = pVVar4->pArray;
        *(undefined8 *)((long)&pVVar7->nCap + lVar9) = 0;
        iVar6 = pVVar4->nCap;
      }
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x10;
    } while (lVar8 < iVar6);
LAB_0074b29c:
    free(pVVar7);
  }
  free(pVVar4);
  pVVar4 = p->vDelayOuts;
  iVar6 = pVVar4->nCap;
  pVVar7 = pVVar4->pArray;
  if (iVar6 < 1) {
    if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_0074b2fc;
  }
  else {
    lVar9 = 8;
    lVar8 = 0;
    do {
      pvVar5 = *(void **)((long)&pVVar7->nCap + lVar9);
      if (pvVar5 != (void *)0x0) {
        free(pvVar5);
        pVVar7 = pVVar4->pArray;
        *(undefined8 *)((long)&pVVar7->nCap + lVar9) = 0;
        iVar6 = pVVar4->nCap;
      }
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x10;
    } while (lVar8 < iVar6);
  }
  free(pVVar7);
LAB_0074b2fc:
  free(pVVar4);
  pVVar7 = p->vOrderPis;
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  pVVar7 = p->vOrderPos;
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  pVVar7 = p->vOrderBoxes;
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  pVVar7 = p->vOrderDelays;
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  pVVar7 = p->vOrderLuts;
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  pVVar7 = p->vOrderSeqs;
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  free(p);
  return;
}

Assistant:

void Gls_ManStop( Gls_Man_t * p )
{
    Vec_StrFree( p->vLines );
    Vec_StrFree( p->vTypes );
    Vec_IntFree( p->vIndexes );
    Vec_IntFree( p->vLut4s );
    Vec_IntFree( p->vLut4TTs );
    Vec_IntFree( p->vLut6s );
    Vec_WrdFree( p->vLut6TTs );
    Vec_IntFree( p->vBoxes );
    Vec_IntFree( p->vDelays );
    Vec_WecFree( p->vDelayIns );
    Vec_WecFree( p->vDelayOuts );
    // ordering
    Vec_IntFree( p->vOrderPis );
    Vec_IntFree( p->vOrderPos );
    Vec_IntFree( p->vOrderBoxes );
    Vec_IntFree( p->vOrderDelays );
    Vec_IntFree( p->vOrderLuts );
    Vec_IntFree( p->vOrderSeqs );
    ABC_FREE( p );
}